

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O2

void wasm::anon_unknown_157::TranslateToExnref::ExnrefLocalAssigner::scan
               (ExnrefLocalAssigner *self,Expression **currp)

{
  Try *curr;
  bool bVar1;
  
  curr = (Try *)*currp;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id == TryId) {
    bVar1 = TargetTryLabelScanner::isTargetedByRethrows(self->labelScanner,curr);
    if (bVar1) {
      Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
                  *)self,decrementRethrowTryDepth,currp);
    }
  }
  PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
  ::scan(self,currp);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id == TryId) {
    bVar1 = TargetTryLabelScanner::isTargetedByRethrows(self->labelScanner,curr);
    if (bVar1) {
      Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
                  *)self,incrementRethrowTryDepth,currp);
      return;
    }
  }
  return;
}

Assistant:

static void scan(ExnrefLocalAssigner* self, Expression** currp) {
      auto* curr = *currp;
      if (auto* tryy = curr->dynCast<Try>()) {
        if (self->labelScanner->isTargetedByRethrows(tryy)) {
          self->pushTask(decrementRethrowTryDepth, currp);
        }
      }
      PostWalker<ExnrefLocalAssigner>::scan(self, currp);
      if (auto* tryy = curr->dynCast<Try>()) {
        if (self->labelScanner->isTargetedByRethrows(tryy)) {
          self->pushTask(incrementRethrowTryDepth, currp);
        }
      }
    }